

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O3

char * mbedtls_ssl_sig_alg_to_str(uint16_t in)

{
  char *pcVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,in) < 0x601) {
    if (CONCAT22(in_register_0000003a,in) < 0x401) {
      if (CONCAT22(in_register_0000003a,in) == 0) {
        return "none";
      }
      if (CONCAT22(in_register_0000003a,in) == 0x201) {
        return "rsa_pkcs1_sha1";
      }
      if (CONCAT22(in_register_0000003a,in) == 0x203) {
        return "ecdsa_sha1";
      }
    }
    else if (CONCAT22(in_register_0000003a,in) < 0x501) {
      if (CONCAT22(in_register_0000003a,in) == 0x401) {
        return "rsa_pkcs1_sha256";
      }
      if (CONCAT22(in_register_0000003a,in) == 0x403) {
        return "ecdsa_secp256r1_sha256";
      }
    }
    else {
      if (CONCAT22(in_register_0000003a,in) == 0x501) {
        return "rsa_pkcs1_sha384";
      }
      if (CONCAT22(in_register_0000003a,in) == 0x503) {
        return "ecdsa_secp384r1_sha384";
      }
    }
LAB_001ac6d2:
    pcVar1 = "UNKNOWN";
  }
  else {
    switch(CONCAT22(in_register_0000003a,in)) {
    case 0x804:
      pcVar1 = "rsa_pss_rsae_sha256";
      break;
    case 0x805:
      pcVar1 = "rsa_pss_rsae_sha384";
      break;
    case 0x806:
      pcVar1 = "rsa_pss_rsae_sha512";
      break;
    case 0x807:
      pcVar1 = "ed25519";
      break;
    case 0x808:
      pcVar1 = "ed448";
      break;
    case 0x809:
      pcVar1 = "rsa_pss_pss_sha256";
      break;
    case 0x80a:
      pcVar1 = "rsa_pss_pss_sha384";
      break;
    case 0x80b:
      pcVar1 = "rsa_pss_pss_sha512";
      break;
    default:
      if (CONCAT22(in_register_0000003a,in) == 0x601) {
        return "rsa_pkcs1_sha512";
      }
      if (CONCAT22(in_register_0000003a,in) == 0x603) {
        return "ecdsa_secp521r1_sha512";
      }
      goto LAB_001ac6d2;
    }
  }
  return pcVar1;
}

Assistant:

const char *mbedtls_ssl_sig_alg_to_str( uint16_t in )
{
    switch( in )
    {
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA256:
        return "rsa_pkcs1_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA384:
        return "rsa_pkcs1_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA512:
        return "rsa_pkcs1_sha512";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP256R1_SHA256:
        return "ecdsa_secp256r1_sha256";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP384R1_SHA384:
        return "ecdsa_secp384r1_sha384";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP521R1_SHA512:
        return "ecdsa_secp521r1_sha512";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA256:
        return "rsa_pss_rsae_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA384:
        return "rsa_pss_rsae_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA512:
        return "rsa_pss_rsae_sha512";
    case MBEDTLS_TLS1_3_SIG_ED25519:
        return "ed25519";
    case MBEDTLS_TLS1_3_SIG_ED448:
        return "ed448";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA256:
        return "rsa_pss_pss_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA384:
        return "rsa_pss_pss_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA512:
        return "rsa_pss_pss_sha512";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA1:
        return "rsa_pkcs1_sha1";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SHA1:
        return "ecdsa_sha1";
    case MBEDTLS_TLS1_3_SIG_NONE:
        return "none";
    };

    return "UNKNOWN";
}